

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O2

bool chaiscript::dispatch::detail::
     call_func<bool(*)(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&)noexcept,bool,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&,0ul>
               (undefined8 param_1,undefined8 *param_2,undefined8 *param_3,
               Type_Conversions_State *param_4)

{
  code *pcVar1;
  undefined1 uVar2;
  chaiscript local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  pcVar1 = (code *)*param_2;
  boxed_cast<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&>
            (local_20,(Boxed_Value *)*param_3,param_4);
  uVar2 = (*pcVar1)(local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return (bool)uVar2;
}

Assistant:

Ret call_func(Ret (*)(Params...),
                    std::index_sequence<I...>,
                    const Callable &f,
                    [[maybe_unused]] const chaiscript::Function_Params &params,
                    [[maybe_unused]] const Type_Conversions_State &t_conversions) {
        return f(boxed_cast<Params>(params[I], &t_conversions)...);
      }